

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace::IfcPolygonalBoundedHalfSpace
          (IfcPolygonalBoundedHalfSpace *this)

{
  IfcPolygonalBoundedHalfSpace *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x78,"IfcPolygonalBoundedHalfSpace");
  IfcHalfSpaceSolid::IfcHalfSpaceSolid
            (&this->super_IfcHalfSpaceSolid,&PTR_construction_vtable_24__0107e8c8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace,_2UL> *)
             &(this->super_IfcHalfSpaceSolid).field_0x58,&PTR_construction_vtable_24__0107e940);
  (this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x107e810;
  *(undefined8 *)&this->field_0x78 = 0x107e8b0;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x107e838;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x107e860;
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x58 = 0x107e888;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
             &(this->super_IfcHalfSpaceSolid).field_0x68,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcBoundedCurve>::Lazy
            (&this->PolygonalBoundary,(LazyObject *)0x0);
  return;
}

Assistant:

IfcPolygonalBoundedHalfSpace() : Object("IfcPolygonalBoundedHalfSpace") {}